

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::Clipper::ClearGhostJoins(Clipper *this)

{
  size_type sVar1;
  reference ppJVar2;
  ulong local_18;
  size_type i;
  Clipper *this_local;
  
  local_18 = 0;
  while( true ) {
    sVar1 = std::vector<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>::size
                      (&this->m_GhostJoins);
    if (sVar1 <= local_18) break;
    ppJVar2 = std::vector<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>::operator[]
                        (&this->m_GhostJoins,local_18);
    if (*ppJVar2 != (value_type)0x0) {
      operator_delete(*ppJVar2,0x20);
    }
    local_18 = local_18 + 1;
  }
  std::vector<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>::resize
            (&this->m_GhostJoins,0);
  return;
}

Assistant:

void Clipper::ClearGhostJoins()
{
  for (JoinList::size_type i = 0; i < m_GhostJoins.size(); i++)
    delete m_GhostJoins[i];
  m_GhostJoins.resize(0);
}